

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

void * calloc(size_t __nmemb,size_t __size)

{
  _Bool _Var1;
  void *pvVar2;
  
  _Var1 = use_hdmp();
  if (_Var1) {
    hdbg.stats.calloc_calls = hdbg.stats.calloc_calls + 1;
    pvVar2 = malloc(__size * __nmemb);
    pvVar2 = memset(pvVar2,0,__size * __nmemb);
    return pvVar2;
  }
  pvVar2 = (*real_calloc)(__nmemb,__size);
  return pvVar2;
}

Assistant:

void *calloc(size_t numelem, size_t size) {
    if (!use_hdmp())
       return real_calloc(numelem, size);
    hdbg.stats.calloc_calls++;
    size *= numelem;
    void *p = malloc(size);
    memset(p, 0, size);
    return p;
}